

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_inter_pred_filters.c
# Opt level: O2

void ihevc_inter_pred_luma_copy_w16out
               (UWORD8 *pu1_src,WORD16 *pi2_dst,WORD32 src_strd,WORD32 dst_strd,WORD8 *pi1_coeff,
               WORD32 ht,WORD32 wd)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = 0;
  uVar1 = (ulong)(uint)wd;
  if (wd < 1) {
    uVar1 = uVar2;
  }
  if (ht < 1) {
    ht = 0;
  }
  for (; (int)uVar2 != ht; uVar2 = (ulong)((int)uVar2 + 1)) {
    for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
      pi2_dst[uVar3] = (ushort)pu1_src[uVar3] << 6;
    }
    pu1_src = pu1_src + src_strd;
    pi2_dst = pi2_dst + dst_strd;
  }
  return;
}

Assistant:

void ihevc_inter_pred_luma_copy_w16out(UWORD8 *pu1_src,
                                       WORD16 *pi2_dst,
                                       WORD32 src_strd,
                                       WORD32 dst_strd,
                                       WORD8 *pi1_coeff,
                                       WORD32 ht,
                                       WORD32 wd)
{
    WORD32 row, col;
    UNUSED(pi1_coeff);
    for(row = 0; row < ht; row++)
    {
        for(col = 0; col < wd; col++)
        {
            pi2_dst[col] = (pu1_src[col] << SHIFT_14_MINUS_BIT_DEPTH);
        }

        pu1_src += src_strd;
        pi2_dst += dst_strd;
    }

}